

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O0

bool_t strEndsWith(char *str,char *suffix)

{
  size_t sVar1;
  size_t sVar2;
  char *in_RSI;
  long in_RDI;
  char *local_18;
  char *local_10;
  bool_t local_4;
  
  sVar1 = strLen((char *)0x11d698);
  sVar2 = strLen((char *)0x11d6a7);
  if (sVar1 < sVar2) {
    local_4 = 0;
  }
  else {
    sVar1 = strLen((char *)0x11d6c8);
    sVar2 = strLen((char *)0x11d6d6);
    local_10 = (char *)((sVar1 - sVar2) + in_RDI);
    for (local_18 = in_RSI; *local_18 != '\0'; local_18 = local_18 + 1) {
      if (*local_10 != *local_18) {
        return 0;
      }
      local_10 = local_10 + 1;
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

bool_t strEndsWith(const char* str, const char* suffix)
{
	ASSERT(strIsValid(str));
	ASSERT(strIsValid(suffix));
	if (strLen(str) < strLen(suffix))
		return FALSE;
	for(str += strLen(str) - strLen(suffix); *suffix; ++suffix, ++str)
		if (*str != *suffix)
			return FALSE;
	return TRUE;
}